

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,duckdb_fmt::v6::basic_format_specs<char>>::bin_writer<3>>
::operator()(padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,duckdb_fmt::v6::basic_format_specs<char>>::bin_writer<3>>
             *this,char **it)

{
  int iVar1;
  long lVar2;
  long lVar3;
  char *__s;
  size_t __n;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  byte *pbVar7;
  ulong uVar8;
  size_t __len;
  char *pcVar9;
  bool bVar10;
  bool bVar11;
  
  lVar2 = *(long *)(this + 0x10);
  if (lVar2 != 0) {
    lVar3 = *(long *)(this + 8);
    pcVar9 = *it;
    lVar6 = 0;
    do {
      pcVar9[lVar6] = *(char *)(lVar3 + lVar6);
      lVar6 = lVar6 + 1;
    } while (lVar2 != lVar6);
    *it = pcVar9 + lVar6;
  }
  __s = *it;
  __n = *(size_t *)(this + 0x20);
  pcVar9 = __s;
  if (__n != 0) {
    pcVar9 = __s + __n;
    switchD_0130b471::default(__s,*(int *)(this + 0x18),__n);
  }
  *it = pcVar9;
  iVar1 = *(int *)(this + 0x40);
  pbVar7 = (byte *)(__s + __n + (long)iVar1);
  uVar5 = *(ulong *)(this + 0x30);
  uVar8 = *(ulong *)(this + 0x38);
  do {
    pbVar7 = pbVar7 + -1;
    *pbVar7 = (byte)uVar5 & 7 | 0x30;
    bVar10 = 7 < uVar5;
    bVar11 = uVar8 != 0;
    uVar4 = -uVar8;
    uVar5 = uVar8 << 0x3d | uVar5 >> 3;
    uVar8 = uVar8 >> 3;
  } while (bVar11 || uVar4 < bVar10);
  *it = pcVar9 + iVar1;
  return;
}

Assistant:

void operator()(It&& it) const {
      if (prefix.size() != 0)
        it = copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }